

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_extend_identifier(idrent *wnp,int numsize,int nullsize)

{
  char *pcVar1;
  int iVar2;
  int wnp_ext_off;
  uchar *p;
  int nullsize_local;
  int numsize_local;
  idrent *wnp_local;
  
  iVar2 = wnp->isoent->ext_off;
  if (wnp->noff + numsize != iVar2) {
    pcVar1 = wnp->isoent->identifier;
    memmove(pcVar1 + (long)numsize + (long)wnp->noff,pcVar1 + iVar2,
            (long)(wnp->isoent->ext_len + nullsize));
    iVar2 = wnp->noff + numsize;
    wnp->isoent->ext_off = iVar2;
    wnp->isoent->id_len = iVar2 + wnp->isoent->ext_len;
  }
  return;
}

Assistant:

static void
idr_extend_identifier(struct idrent *wnp, int numsize, int nullsize)
{
	unsigned char *p;
	int wnp_ext_off;

	wnp_ext_off = wnp->isoent->ext_off;
	if (wnp->noff + numsize != wnp_ext_off) {
		p = (unsigned char *)wnp->isoent->identifier;
		/* Extend the filename; foo.c --> foo___.c */
		memmove(p + wnp->noff + numsize, p + wnp_ext_off,
		    wnp->isoent->ext_len + nullsize);
		wnp->isoent->ext_off = wnp_ext_off = wnp->noff + numsize;
		wnp->isoent->id_len = wnp_ext_off + wnp->isoent->ext_len;
	}
}